

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-huitre39.c
# Opt level: O0

xml_node * get_node_by_name(xml_node *base,uint8_t *name)

{
  int iVar1;
  size_t __n;
  uint8_t *__s;
  size_t sVar2;
  xml_node *pxVar3;
  xml_node *pxVar4;
  xml_node *search_result;
  xml_node *child_node;
  size_t child;
  size_t number_of_children;
  int rs;
  size_t base_name_length;
  uint8_t *base_name;
  size_t name_length;
  uint8_t *name_local;
  xml_node *base_local;
  
  __n = strlen((char *)name);
  __s = xml_easy_name(base);
  sVar2 = strlen((char *)__s);
  if ((__n == sVar2) && (iVar1 = memcmp(name,__s,__n), iVar1 == 0)) {
    free(__s);
    base_local = base;
  }
  else {
    free(__s);
    pxVar3 = (xml_node *)xml_node_children(base);
    if (pxVar3 == (xml_node *)0x0) {
      base_local = (xml_node *)0x0;
    }
    else {
      for (child_node = (xml_node *)0x0; child_node < pxVar3;
          child_node = (xml_node *)((long)&child_node->name + 1)) {
        pxVar4 = xml_node_child(base,(size_t)child_node);
        pxVar4 = get_node_by_name(pxVar4,name);
        if (pxVar4 != (xml_node *)0x0) {
          return pxVar4;
        }
      }
      base_local = (xml_node *)0x0;
    }
  }
  return base_local;
}

Assistant:

static struct xml_node* get_node_by_name(struct xml_node* base, uint8_t* name) {


	/* Check whether `base` already has the tag name we are searching for
	 */
	size_t const name_length = strlen(name);

	uint8_t* base_name = xml_easy_name(base);
	size_t const base_name_length = strlen(base_name);


	/* Length of `name` and `base_name` do match, we should now do a real
	 * comparison
	 */
	if (name_length == base_name_length) {
		int const rs = memcmp(name, base_name, name_length);

		/* Names match! We have found an element which fullfills our
		 * search criteria
		 */
		if (!rs) {
			free(base_name);
			return base;
		}
	}


	/* Unfortunately, `base` is not the element we are looking for :-(
	 */
	free(base_name);


	/* Let's take a look at the children of `base`
	 */
	size_t const number_of_children = xml_node_children(base);


	/* No children → No luck with base
	 */
	if (!number_of_children) {
		return 0;
	}


	/* Recursivly look through all children
	 */
	size_t child = 0; for (; child < number_of_children; ++child) {
		struct xml_node* child_node = xml_node_child(base, child);

		/* Maybe this child does contain the element we are looking for?
		 */
		struct xml_node* search_result = get_node_by_name(
			child_node, name
		);

		/* We are lucky!
		 */
		if (search_result) {
			return search_result;
		}
	}


	/* No luck :-(
	 */
	return 0;
}